

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall ExprTest_CheckIndex_Test::TestBody(ExprTest_CheckIndex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  
  mp::internal::CheckIndex(0,3);
  mp::internal::CheckIndex(2,3);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid index",(allocator<char> *)&local_50);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::CheckIndex(-10,3);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [118])
               "Expected: mp::internal::CheckIndex(-10, 3) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x80,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid index",(allocator<char> *)&local_50);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::CheckIndex(-1,3);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [117])
               "Expected: mp::internal::CheckIndex(-1, 3) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x81,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid index",(allocator<char> *)&local_50);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::CheckIndex(3,3);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [116])
               "Expected: mp::internal::CheckIndex(3, 3) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x82,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid index",(allocator<char> *)&local_50);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::CheckIndex(10,3);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [117])
               "Expected: mp::internal::CheckIndex(10, 3) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x83,
             pcVar2);
  testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprTest, CheckIndex) {
  mp::internal::CheckIndex(0, 3);
  mp::internal::CheckIndex(2, 3);
  EXPECT_ASSERT(mp::internal::CheckIndex(-10, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(-1, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(3, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(10, 3), "invalid index");
}